

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

Fl_Type * write_code(Fl_Type *p)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int level_1;
  int level;
  Fl_Type *q;
  Fl_Type *p_local;
  
  if (write_sourceview != 0) {
    lVar4 = ftell((FILE *)code_file);
    p->code_position = (int)lVar4;
    if (p->header_position_end == -1) {
      lVar4 = ftell((FILE *)header_file);
      p->header_position = (int)lVar4;
    }
  }
  if ((p != Fl_Type::last) || (iVar3 = (*p->_vptr_Fl_Type[0x25])(), iVar3 == 0)) {
    (*p->_vptr_Fl_Type[0x11])();
  }
  iVar3 = (*p->_vptr_Fl_Type[0x17])();
  if ((iVar3 == 0) || (iVar3 = (*p->_vptr_Fl_Type[0x26])(), iVar3 == 0)) {
    _level_1 = p->next;
    while( true ) {
      bVar2 = false;
      if (_level_1 != (Fl_Type *)0x0) {
        bVar2 = p->level < _level_1->level;
      }
      if (!bVar2) break;
      _level_1 = write_code(_level_1);
    }
    (*p->_vptr_Fl_Type[0x12])();
  }
  else {
    _level_1 = p->next;
    while( true ) {
      bVar2 = false;
      if (_level_1 != (Fl_Type *)0x0) {
        bVar2 = p->level < _level_1->level;
      }
      if (!bVar2) break;
      iVar3 = (*_level_1->_vptr_Fl_Type[5])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"Function");
      if (iVar3 == 0) {
        piVar1 = &_level_1->level;
        do {
          _level_1 = _level_1->next;
          bVar2 = false;
          if (_level_1 != (Fl_Type *)0x0) {
            bVar2 = *piVar1 < _level_1->level;
          }
        } while (bVar2);
      }
      else {
        _level_1 = write_code(_level_1);
      }
    }
    (*p->_vptr_Fl_Type[0x12])();
    _level_1 = p->next;
    while( true ) {
      bVar2 = false;
      if (_level_1 != (Fl_Type *)0x0) {
        bVar2 = p->level < _level_1->level;
      }
      if (!bVar2) break;
      iVar3 = (*_level_1->_vptr_Fl_Type[5])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"Function");
      if (iVar3 == 0) {
        _level_1 = write_code(_level_1);
      }
      else {
        piVar1 = &_level_1->level;
        do {
          _level_1 = _level_1->next;
          bVar2 = false;
          if (_level_1 != (Fl_Type *)0x0) {
            bVar2 = *piVar1 < _level_1->level;
          }
        } while (bVar2);
      }
    }
    write_h("};\n");
    current_widget_class = (Fl_Widget_Class_Type *)0x0;
  }
  if (write_sourceview != 0) {
    lVar4 = ftell((FILE *)code_file);
    p->code_position_end = (int)lVar4;
    if (p->header_position_end == -1) {
      lVar4 = ftell((FILE *)header_file);
      p->header_position_end = (int)lVar4;
    }
  }
  return _level_1;
}

Assistant:

static Fl_Type* write_code(Fl_Type* p) {
  if (write_sourceview) {
    p->code_position = (int)ftell(code_file);
    if (p->header_position_end==-1)
      p->header_position = (int)ftell(header_file);
  }
  // write all code that come before the children code
  // (but don't write the last comment until the very end)
  if (!(p==Fl_Type::last && p->is_comment()))
    p->write_code1();
  // recursively write the code of all children
  Fl_Type* q;
  if (p->is_widget() && p->is_class()) {
    // Handle widget classes specially
    for (q = p->next; q && q->level > p->level;) {
      if (strcmp(q->type_name(), "Function")) q = write_code(q);
      else {
        int level = q->level;
	do {
	  q = q->next;
	} while (q && q->level > level);
      }
    }

    // write all code that come after the children 
    p->write_code2();

    for (q = p->next; q && q->level > p->level;) {
      if (!strcmp(q->type_name(), "Function")) q = write_code(q);
      else {
        int level = q->level;
	do {
	  q = q->next;
	} while (q && q->level > level);
      }
    }

    write_h("};\n");
    current_widget_class = 0L;
  } else {
    for (q = p->next; q && q->level > p->level;) q = write_code(q);
    // write all code that come after the children 
    p->write_code2();
  }
  if (write_sourceview) {
    p->code_position_end = (int)ftell(code_file);
    if (p->header_position_end==-1)
      p->header_position_end = (int)ftell(header_file);
  }
  return q;
}